

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  ulong *puVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  ulong *puVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  BIT_CStream_t blockStream;
  FSE_CState_t local_90;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  
  if (bmi2 != 0) {
    sVar6 = ZSTD_encodeSequences_bmi2
                      (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,ofCodeTable,
                       CTable_LitLength,llCodeTable,sequences,nbSeq,longOffsets);
    return sVar6;
  }
  puVar7 = (ulong *)((long)dst + (dstCapacity - 8));
  if (dstCapacity < 9) {
    sVar6 = 0xffffffffffffffba;
  }
  else {
    blockStream.startPtr = (char *)dst;
    blockStream.endPtr = (char *)puVar7;
    FSE_initCState2(&stateMatchLength,CTable_MatchLength,(uint)mlCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateOffsetBits,CTable_OffsetBits,(uint)ofCodeTable[nbSeq - 1]);
    FSE_initCState2(&local_90,CTable_LitLength,(uint)llCodeTable[nbSeq - 1]);
    bVar13 = ""[llCodeTable[nbSeq - 1]];
    uVar15 = (ulong)((uint)sequences[nbSeq - 1].mlBase & BIT_mask[""[mlCodeTable[nbSeq - 1]]]) <<
             (bVar13 & 0x3f) | (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[bVar13]);
    uVar4 = (uint)""[mlCodeTable[nbSeq - 1]] + (uint)bVar13;
    if (longOffsets == 0) {
      uVar15 = (ulong)(BIT_mask[ofCodeTable[nbSeq - 1]] & sequences[nbSeq - 1].offBase) <<
               ((byte)uVar4 & 0x3f) | uVar15;
      uVar9 = uVar4 + ofCodeTable[nbSeq - 1];
    }
    else {
      uVar9 = (uint)ofCodeTable[nbSeq - 1];
      puVar11 = (ulong *)dst;
      if (uVar9 < 0x38) {
        uVar10 = sequences[nbSeq - 1].offBase;
        bVar13 = 0;
      }
      else {
        uVar14 = 0;
        uVar10 = sequences[nbSeq - 1].offBase;
        if (uVar9 != 0x38) {
          uVar14 = (ulong)(uVar9 - 0x38);
          uVar15 = (ulong)(BIT_mask[uVar14] & uVar10) << ((byte)uVar4 & 0x3f) | uVar15;
          uVar4 = (uVar9 + uVar4) - 0x38;
          puVar11 = (ulong *)((ulong)(uVar4 >> 3) + (long)dst);
          if (puVar7 < puVar11) {
            puVar11 = puVar7;
          }
          *(ulong *)dst = uVar15;
          uVar15 = uVar15 >> ((byte)uVar4 & 0x38);
          uVar4 = uVar4 & 7;
        }
        bVar13 = (byte)uVar14;
        uVar9 = 0x38;
      }
      uVar15 = (ulong)(uVar10 >> (bVar13 & 0x1f) & BIT_mask[uVar9]) << ((byte)uVar4 & 0x3f) | uVar15
      ;
      uVar9 = uVar9 + uVar4;
      dst = puVar11;
    }
    *(ulong *)dst = uVar15;
    blockStream.ptr = (char *)((ulong)(uVar9 >> 3) + (long)dst);
    if (puVar7 < blockStream.ptr) {
      blockStream.ptr = (char *)puVar7;
    }
    blockStream.bitContainer = uVar15 >> ((byte)uVar9 & 0x38);
    for (uVar15 = nbSeq - 2; blockStream.bitPos = uVar9 & 7, uVar15 < nbSeq; uVar15 = uVar15 - 1) {
      bVar13 = llCodeTable[uVar15];
      bVar1 = ofCodeTable[uVar15];
      uVar9 = (uint)bVar1;
      bVar2 = mlCodeTable[uVar15];
      uVar5 = (uint)""[bVar13];
      bVar3 = ""[bVar2];
      FSE_encodeSymbol(&blockStream,&stateOffsetBits,uVar9);
      FSE_encodeSymbol(&blockStream,&stateMatchLength,(uint)bVar2);
      FSE_encodeSymbol(&blockStream,&local_90,(uint)bVar13);
      uVar10 = uVar5 + uVar9 + (uint)bVar3;
      uVar4 = blockStream.bitPos;
      if (0x1e < uVar10) {
        *(size_t *)blockStream.ptr = blockStream.bitContainer;
        blockStream.ptr = blockStream.ptr + (blockStream.bitPos >> 3);
        if (blockStream.endPtr < blockStream.ptr) {
          blockStream.ptr = blockStream.endPtr;
        }
        uVar4 = blockStream.bitPos & 7;
        blockStream.bitContainer = blockStream.bitContainer >> ((byte)blockStream.bitPos & 0x38);
      }
      uVar14 = (ulong)((uint)sequences[uVar15].mlBase & BIT_mask[(uint)bVar3]) <<
               ((byte)(uVar4 + uVar5) & 0x3f) |
               (ulong)((uint)sequences[uVar15].litLength & BIT_mask[uVar5]) << ((byte)uVar4 & 0x3f)
               | blockStream.bitContainer;
      uVar5 = uVar4 + uVar5 + (uint)bVar3;
      uVar4 = uVar5;
      if (0x38 < uVar10) {
        *(ulong *)blockStream.ptr = uVar14;
        blockStream.ptr = blockStream.ptr + (uVar5 >> 3);
        if (blockStream.endPtr < blockStream.ptr) {
          blockStream.ptr = blockStream.endPtr;
        }
        uVar4 = uVar5 & 7;
        uVar14 = uVar14 >> ((byte)uVar5 & 0x38);
      }
      if (longOffsets == 0) {
        uVar14 = (ulong)(BIT_mask[bVar1] & sequences[uVar15].offBase) << ((byte)uVar4 & 0x3f) |
                 uVar14;
        uVar9 = uVar4 + uVar9;
      }
      else {
        if (bVar1 < 0x38) {
          uVar10 = sequences[uVar15].offBase;
          bVar13 = 0;
        }
        else {
          uVar12 = 0;
          uVar10 = sequences[uVar15].offBase;
          if (uVar9 != 0x38) {
            uVar12 = (ulong)(uVar9 - 0x38);
            uVar14 = (ulong)(BIT_mask[uVar12] & uVar10) << ((byte)uVar4 & 0x3f) | uVar14;
            uVar4 = (uVar4 + uVar9) - 0x38;
            *(ulong *)blockStream.ptr = uVar14;
            blockStream.ptr = blockStream.ptr + (uVar4 >> 3);
            if (blockStream.endPtr < blockStream.ptr) {
              blockStream.ptr = blockStream.endPtr;
            }
            uVar14 = uVar14 >> ((byte)uVar4 & 0x38);
            uVar4 = uVar4 & 7;
          }
          bVar13 = (byte)uVar12;
          uVar9 = 0x38;
        }
        uVar14 = (ulong)(uVar10 >> (bVar13 & 0x1f) & BIT_mask[uVar9]) << ((byte)uVar4 & 0x3f) |
                 uVar14;
        uVar9 = uVar9 + uVar4;
      }
      *(ulong *)blockStream.ptr = uVar14;
      blockStream.ptr = blockStream.ptr + (uVar9 >> 3);
      if (blockStream.endPtr < blockStream.ptr) {
        blockStream.ptr = blockStream.endPtr;
      }
      blockStream.bitContainer = uVar14 >> ((byte)uVar9 & 0x38);
    }
    FSE_flushCState(&blockStream,&stateMatchLength);
    FSE_flushCState(&blockStream,&stateOffsetBits);
    FSE_flushCState(&blockStream,&local_90);
    sVar8 = BIT_closeCStream(&blockStream);
    sVar6 = 0xffffffffffffffba;
    if (sVar8 != 0) {
      sVar6 = sVar8;
    }
  }
  return sVar6;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}